

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTAudioEngine_SetGlobalVariable(FACTAudioEngine *pEngine,uint16_t nIndex,float nValue)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  byte *pbVar4;
  ushort in_SI;
  long in_RDI;
  float in_XMM0_Da;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  FACTVariable *var;
  float local_2c;
  float local_28;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x113c58);
  pbVar4 = (byte *)(*(long *)(in_RDI + 0x58) + (ulong)in_SI * 0x10);
  do {
    if ((*pbVar4 & 1) != 0) goto LAB_00113ccb;
    iVar2 = SDL_ReportAssertion(&FACTAudioEngine_SetGlobalVariable::sdl_assert_data,
                                "FACTAudioEngine_SetGlobalVariable",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                ,0x3f6);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_00113ccb:
  do {
    if ((*pbVar4 & 2) == 0) goto LAB_00113d24;
    iVar2 = SDL_ReportAssertion(&FACTAudioEngine_SetGlobalVariable::sdl_assert_data_1,
                                "FACTAudioEngine_SetGlobalVariable",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                ,0x3f7);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_00113d24:
  do {
    if ((*pbVar4 & 4) == 0) goto LAB_00113d79;
    iVar2 = SDL_ReportAssertion(&FACTAudioEngine_SetGlobalVariable::sdl_assert_data_2,
                                "FACTAudioEngine_SetGlobalVariable",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                ,0x3f8);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_00113d79:
  if (in_XMM0_Da < *(float *)(pbVar4 + 0xc) || in_XMM0_Da == *(float *)(pbVar4 + 0xc)) {
    local_2c = in_XMM0_Da;
    if (in_XMM0_Da < *(float *)(pbVar4 + 8)) {
      local_2c = *(float *)(pbVar4 + 8);
    }
    local_28 = local_2c;
  }
  else {
    local_28 = *(float *)(pbVar4 + 0xc);
  }
  *(float *)(*(long *)(in_RDI + 0x90) + (ulong)in_SI * 4) = local_28;
  FAudio_PlatformUnlockMutex((FAudioMutex)0x113e08);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_SetGlobalVariable(
	FACTAudioEngine *pEngine,
	uint16_t nIndex,
	float nValue
) {
	FACTVariable *var;

	FAudio_PlatformLockMutex(pEngine->apiLock);

	var = &pEngine->variables[nIndex];
	FAudio_assert(var->accessibility & 0x01);
	FAudio_assert(!(var->accessibility & 0x02));
	FAudio_assert(!(var->accessibility & 0x04));
	pEngine->globalVariableValues[nIndex] = FAudio_clamp(
		nValue,
		var->minValue,
		var->maxValue
	);

	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}